

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::NeuralNetworkClassifier::Clear(NeuralNetworkClassifier *this)

{
  string *default_value;
  Arena *pAVar1;
  NeuralNetworkClassifier *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Clear
            (&this->layers_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::Clear
            (&this->preprocessing_);
  default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena
            (&this->labelprobabilitylayername_,default_value);
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->updateparams_ != (NetworkUpdateParameters *)0x0)) &&
     (this->updateparams_ != (NetworkUpdateParameters *)0x0)) {
    (*(this->updateparams_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->updateparams_ = (NetworkUpdateParameters *)0x0;
  memset(&this->arrayinputshapemapping_,0,8);
  clear_ClassLabels(this);
  return;
}

Assistant:

void NeuralNetworkClassifier::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.NeuralNetworkClassifier)
  layers_.Clear();
  preprocessing_.Clear();
  labelprobabilitylayername_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (GetArenaNoVirtual() == NULL && updateparams_ != NULL) {
    delete updateparams_;
  }
  updateparams_ = NULL;
  ::memset(&arrayinputshapemapping_, 0, reinterpret_cast<char*>(&imageinputshapemapping_) -
    reinterpret_cast<char*>(&arrayinputshapemapping_) + sizeof(imageinputshapemapping_));
  clear_ClassLabels();
}